

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int fits_img_compress(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  int bitpix;
  int naxis;
  long naxes [6];
  int local_50;
  int local_4c;
  long local_48 [6];
  
  if (0 < *status) {
    return *status;
  }
  iVar2 = ffgipr(infptr,6,&local_50,&local_4c,local_48,status);
  if (iVar2 < 1) {
    if (local_4c - 7U < 0xfffffffa) {
      ffpmsg("Image cannot be compressed: NAXIS out of range");
      *status = 0xd4;
      return 0xd4;
    }
    ffcrhd(outfptr,status);
    pFVar1 = outfptr->Fptr;
    if (pFVar1->curhdu == 0) {
      ffcrim(outfptr,0x10,0,(long *)0x0,status);
      ffcrhd(outfptr,status);
    }
    else {
      pFVar1->hcomp_scale = 0.0;
      *(undefined8 *)&pFVar1->compress_type = 0;
      *(undefined8 *)((long)pFVar1->tilesize + 4) = 0;
      *(undefined8 *)((long)pFVar1->tilesize + 0xc) = 0;
      *(undefined8 *)((long)pFVar1->tilesize + 0x14) = 0;
      *(undefined8 *)((long)pFVar1->tilesize + 0x1c) = 0;
      *(undefined8 *)((long)pFVar1->tilesize + 0x24) = 0;
      *(undefined8 *)((long)pFVar1->tilesize + 0x2c) = 0;
      pFVar1->quantize_method = 0;
      pFVar1->dither_seed = 0;
    }
    fits_set_compression_pref(infptr,outfptr,status);
    if ((outfptr->Fptr->request_lossy_int_compress != 0) && (0 < local_50)) {
      local_50 = -0x20;
    }
    iVar2 = imcomp_init_table(outfptr,local_50,local_4c,local_48,0,status);
    if ((iVar2 < 1) && (iVar2 = imcomp_copy_img2comp(infptr,outfptr,status), iVar2 < 1)) {
      if ((outfptr->Fptr->request_lossy_int_compress == 0) && (0 < local_50)) {
        ffpscl(infptr,1.0,0.0,status);
      }
      ffrdef(outfptr,status);
      if ((outfptr->Fptr->request_lossy_int_compress == 0) && (0 < local_50)) {
        ffpscl(outfptr,1.0,0.0,status);
      }
      imcomp_compress_image(infptr,outfptr,status);
      ffrdef(outfptr,status);
      pFVar1 = outfptr->Fptr;
      pFVar1->request_compress_type = 0;
      pFVar1->request_quantize_level = 0.0;
      pFVar1->request_quantize_method = 0;
      pFVar1->request_dither_seed = 0;
      pFVar1->request_lossy_int_compress = 0;
      pFVar1->request_tilesize[4] = 0;
      pFVar1->request_tilesize[5] = 0;
      pFVar1->request_tilesize[2] = 0;
      pFVar1->request_tilesize[3] = 0;
      pFVar1->request_tilesize[0] = 0;
      pFVar1->request_tilesize[1] = 0;
      pFVar1->request_huge_hdu = 0;
      pFVar1->request_hcomp_scale = 0.0;
    }
  }
  return *status;
}

Assistant:

int fits_img_compress(fitsfile *infptr, /* pointer to image to be compressed */
                 fitsfile *outfptr, /* empty HDU for output compressed image */
                 int *status)       /* IO - error status               */

/*
   This routine initializes the output table, copies all the keywords,
   and  loops through the input image, compressing the data and
   writing the compressed tiles to the output table.
   
   This is a high level routine that is called by the fpack and funpack
   FITS compression utilities.
*/
{
    int bitpix, naxis;
    long naxes[MAX_COMPRESS_DIM];
/*    int c1, c2, c3; */

    if (*status > 0)
        return(*status);


    /* get datatype and size of input image */
    if (fits_get_img_param(infptr, MAX_COMPRESS_DIM, &bitpix, 
                       &naxis, naxes, status) > 0)
        return(*status);

    if (naxis < 1 || naxis > MAX_COMPRESS_DIM)
    {
        ffpmsg("Image cannot be compressed: NAXIS out of range");
        return(*status = BAD_NAXIS);
    }

    /* create a new empty HDU in the output file now, before setting the */
    /* compression preferences.  This HDU will become a binary table that */
    /* contains the compressed image.  If necessary, create a dummy primary */
    /* array, which much precede the binary table extension. */
    
    ffcrhd(outfptr, status);  /* this does nothing if the output file is empty */

    if ((outfptr->Fptr)->curhdu == 0)  /* have to create dummy primary array */
    {
       ffcrim(outfptr, 16, 0, NULL, status);
       ffcrhd(outfptr, status);
    } else {
        /* unset any compress parameter preferences that may have been
           set when closing the previous HDU in the output file */
        fits_unset_compression_param(outfptr, status);
    }
    
    /* set any compress parameter preferences as given in the input file */
    fits_set_compression_pref(infptr, outfptr, status);

    /* special case: the quantization level is not given by a keyword in  */
    /* the HDU header, so we have to explicitly copy the requested value */
    /* to the actual value */
/* do this in imcomp_get_compressed_image_par, instead
    if ( (outfptr->Fptr)->request_quantize_level != 0.)
        (outfptr->Fptr)->quantize_level = (outfptr->Fptr)->request_quantize_level;
*/
    /* if requested, treat integer images same as a float image. */
    /* Then the pixels will be quantized (lossy algorithm) to achieve */
    /* higher amounts of compression than with lossless algorithms */

    if ( (outfptr->Fptr)->request_lossy_int_compress != 0  && bitpix > 0) 
	bitpix = FLOAT_IMG;  /* compress integer images as if float */

    /* initialize output table */
    if (imcomp_init_table(outfptr, bitpix, naxis, naxes, 0, status) > 0)
        return (*status);    

    /* Copy the image header keywords to the table header. */
    if (imcomp_copy_img2comp(infptr, outfptr, status) > 0)
	    return (*status);

    /* turn off any intensity scaling (defined by BSCALE and BZERO */
    /* keywords) so that unscaled values will be read by CFITSIO */
    /* (except if quantizing an int image, same as a float image) */
    if ( (outfptr->Fptr)->request_lossy_int_compress == 0 && bitpix > 0) 
        ffpscl(infptr, 1.0, 0.0, status);

    /* force a rescan of the output file keywords, so that */
    /* the compression parameters will be copied to the internal */
    /* fitsfile structure used by CFITSIO */
    ffrdef(outfptr, status);

    /* turn off any intensity scaling (defined by BSCALE and BZERO */
    /* keywords) so that unscaled values will be written by CFITSIO */
    /* (except if quantizing an int image, same as a float image) */
    if ( (outfptr->Fptr)->request_lossy_int_compress == 0 && bitpix > 0) 
        ffpscl(outfptr, 1.0, 0.0, status);

    /* Read each image tile, compress, and write to a table row. */
    imcomp_compress_image (infptr, outfptr, status);

    /* force another rescan of the output file keywords, to */
    /* update PCOUNT and TFORMn = '1PB(iii)' keyword values. */
    ffrdef(outfptr, status);

    /* unset any previously set compress parameter preferences */
    fits_unset_compression_request(outfptr, status);

/*
    fits_get_case(&c1, &c2, &c3);
    printf("c1, c2, c3 = %d, %d, %d\n", c1, c2, c3); 
*/

    return (*status);
}